

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

void __thiscall
google::protobuf::MethodOptions::set_idempotency_level
          (MethodOptions *this,MethodOptions_IdempotencyLevel value)

{
  if (value < (MethodOptions_IdempotencyLevel_IDEMPOTENT|
              MethodOptions_IdempotencyLevel_NO_SIDE_EFFECTS)) {
    *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 2;
    this->idempotency_level_ = value;
    return;
  }
  __assert_fail("::google::protobuf::MethodOptions_IdempotencyLevel_IsValid(value)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.pb.h"
                ,0x1e1a,
                "void google::protobuf::MethodOptions::set_idempotency_level(::google::protobuf::MethodOptions_IdempotencyLevel)"
               );
}

Assistant:

bool MethodOptions_IdempotencyLevel_IsValid(int value) {
  switch (value) {
    case 0:
    case 1:
    case 2:
      return true;
    default:
      return false;
  }
}